

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *__x;
  long lVar3;
  int kI;
  long lVar4;
  shared_ptr<Population> *population;
  pointer psVar5;
  allocator<char> local_169;
  shared_ptr<Population> p;
  CellTypeDirector director;
  PopulationDirector d;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> populations;
  shared_ptr<CellTypeJSONRepresentationBuilder> jsonBuilder;
  shared_ptr<CellTypeBuilder> builder;
  json waterCell;
  shared_ptr<CellType> steppeCell;
  Map map;
  Player player;
  __shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<AbstractCellTypeBuilder,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<AbstractCellTypeBuilder,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"***Create cell example code***");
  std::endl<char,std::char_traits<char>>(poVar2);
  director.builderPtr.super___shared_ptr<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  director.builderPtr.super___shared_ptr<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<CellTypeBuilder>();
  std::__shared_ptr<AbstractCellTypeBuilder,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<CellTypeBuilder,void>
            (local_58,&builder.super___shared_ptr<CellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>);
  CellTypeDirector::setBuilder(&director,local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  CellTypeDirector::makeSteppeCell();
  CellTypeBuilder::getProduct();
  poVar2 = (ostream *)
           operator<<((ostream *)&std::cout,
                      steppeCell.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::make_shared<CellTypeJSONRepresentationBuilder>();
  std::__shared_ptr<AbstractCellTypeBuilder,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<CellTypeJSONRepresentationBuilder,void>
            (local_68,&jsonBuilder.
                       super___shared_ptr<CellTypeJSONRepresentationBuilder,_(__gnu_cxx::_Lock_policy)2>
            );
  CellTypeDirector::setBuilder(&director,local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  CellTypeDirector::makeWaterCell();
  CellTypeJSONRepresentationBuilder::getProduct_abi_cxx11_();
  poVar2 = nlohmann::operator<<((ostream *)&std::cout,&waterCell);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"***Create population example code***");
  std::endl<char,std::char_traits<char>>(poVar2);
  d.builder.super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  d.builder.super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<HerbivorePopulationBuilder>();
  local_48._M_ptr =
       (element_type *)
       player.playerPopulations.
       super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       player.playerPopulations.
       super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  player.playerPopulations.
  super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  player.playerPopulations.
  super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &player.playerPopulations.
              super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,&local_48);
  PopulationDirector::setBuilder(&d,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&player,"elephant",(allocator<char> *)&populations);
  PopulationDirector::makeBig((string *)&p);
  std::__cxx11::string::~string((string *)&player);
  operator<<((ostream *)&std::cout,
             (Population *)p.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  poVar2 = std::operator<<((ostream *)&std::cout,"***Mutation example code***");
  std::endl<char,std::char_traits<char>>(poVar2);
  Population::mutate((MutationType)
                     p.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  operator<<((ostream *)&std::cout,
             (Population *)p.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  Population::mutate((MutationType)
                     p.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  operator<<((ostream *)&std::cout,
             (Population *)p.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  poVar2 = std::operator<<((ostream *)&std::cout,"***Generate map example code***");
  std::endl<char,std::char_traits<char>>(poVar2);
  Map::Map(&map,10,10);
  Map::generate();
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    for (lVar3 = 0; lVar3 != 0xa0; lVar3 = lVar3 + 0x10) {
      Map::operator[]((ulong)&map);
      iVar1 = CellType::getType();
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::operator<<(poVar2," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"***Generate player example code***");
  std::endl<char,std::char_traits<char>>(poVar2);
  player.name._M_dataplus._M_p = (pointer)&player.name.field_2;
  player.playerPopulations.
  super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  player.playerPopulations.
  super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  player.playerPopulations.
  super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  player.name._M_string_length = 0;
  player.name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&populations,"Cat",&local_169);
  Player::SetName((string *)&player);
  std::__cxx11::string::~string((string *)&populations);
  Player::generatePopulations();
  __x = (vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *)
        Player::GetPlayerPopulations();
  std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::vector
            (&populations,__x);
  for (psVar5 = populations.
                super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar5 != populations.
                super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
    poVar2 = (ostream *)
             operator<<((ostream *)&std::cout,
                        (Population *)
                        (psVar5->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::~vector
            (&populations);
  Player::~Player(&player);
  std::
  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
  ::~vector((vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
             *)&map);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&d.builder.super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&waterCell);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&jsonBuilder.
              super___shared_ptr<CellTypeJSONRepresentationBuilder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&steppeCell.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&builder.super___shared_ptr<CellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&director.builderPtr.
              super___shared_ptr<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main() {
  std::cout << "***Create cell example code***" << std:: endl;

  CellTypeDirector director;

  auto builder = std::make_shared<CellTypeBuilder>();
  director.setBuilder(builder);
  director.makeSteppeCell();
  std::shared_ptr<CellType> steppeCell = builder -> getProduct();
  std::cout << *steppeCell << std::endl;

  auto jsonBuilder = std::make_shared<CellTypeJSONRepresentationBuilder>();
  director.setBuilder(jsonBuilder);
  director.makeWaterCell();
  auto waterCell = jsonBuilder -> getProduct();
  std::cout << waterCell << std::endl;


  std::cout << "***Create population example code***" << std:: endl;
  PopulationDirector d;
  std::shared_ptr<PopulationBuilder> b = std::make_shared<HerbivorePopulationBuilder>();
  d.setBuilder(b);
  std::shared_ptr<Population> p = d.makeBig("elephant");
  std::cout << *p;

  std::cout << "***Mutation example code***" << std::endl;
  p->mutate(Population::MutationType::VELOCITY);
  std::cout << *p;
  p->mutate(Population::MutationType::SIZE);
  std::cout << *p;

  std::cout << "***Generate map example code***" << std::endl;
  Map map(10, 10);
  map.generate();
  for (int kI = 0; kI < 10; ++kI) {
    for (int kJ = 0; kJ < 10; ++kJ) {
      std::cout << map[kI][kJ] -> getType() << " ";
    }
    std::cout << std::endl;
  }

  std::cout << "***Generate player example code***" << std::endl;
  Player player;
  player.SetName("Cat");
  player.generatePopulations();
  auto populations = player.GetPlayerPopulations();
  for (auto &population : populations) {
    std::cout << *population << std::endl;
  }

  return 0;
}